

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

Promise<void> __thiscall kj::UnixEventPort::FdObserver::whenUrgentDataAvailable(FdObserver *this)

{
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar1;
  PromiseFulfillerPair<void> paf;
  Own<kj::PromiseFulfiller<void>_> local_48;
  PromiseFulfillerPair<void> local_38;
  
  if ((*(byte *)(in_RSI + 0xc) & 4) != 0) {
    newPromiseAndFulfiller<void>();
    local_48.disposer = local_38.fulfiller.disposer;
    local_48.ptr = local_38.fulfiller.ptr;
    local_38.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
    Own<kj::PromiseFulfiller<void>_>::operator=
              ((Own<kj::PromiseFulfiller<void>_> *)(in_RSI + 0x30),&local_48);
    Own<kj::PromiseFulfiller<void>_>::dispose(&local_48);
    this->eventPort = (UnixEventPort *)local_38.promise.super_PromiseBase.node.disposer;
    *(PromiseNode **)&this->fd = local_38.promise.super_PromiseBase.node.ptr;
    local_38.promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    PromiseFulfillerPair<void>::~PromiseFulfillerPair(&local_38);
    PVar1.super_PromiseBase.node.ptr = extraout_RDX;
    PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<void>)PVar1.super_PromiseBase.node;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[63]>
            ((Fault *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x191,FAILED,"flags & OBSERVE_URGENT",
             "\"FdObserver was not set to observe availability of urgent data.\"",
             (char (*) [63])"FdObserver was not set to observe availability of urgent data.");
  _::Debug::Fault::fatal((Fault *)&local_38);
}

Assistant:

Promise<void> UnixEventPort::FdObserver::whenUrgentDataAvailable() {
  KJ_REQUIRE(flags & OBSERVE_URGENT,
      "FdObserver was not set to observe availability of urgent data.");

  auto paf = newPromiseAndFulfiller<void>();
  urgentFulfiller = kj::mv(paf.fulfiller);
  return kj::mv(paf.promise);
}